

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell::createTest
          (TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell *this)

{
  TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test *this_00;
  TEST_TeamCityOutputTest_PrintWithEscapedCharacters_TestShell *this_local;
  
  this_00 = (TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x90);
  TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test::
  TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TeamCityOutputTest, PrintWithEscapedCharacters)
{
    tcout->printFailure(*f3);
    const char* expected =
            "##teamcity[testFailed name='test' message='file:30' "
            "details='apos|' pipe|| |[brackets|]"
            "|r|nCRLF']\n";
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}